

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declaration.cc
# Opt level: O3

void __thiscall
tchecker::parsing::location_declaration_t::location_declaration_t
          (location_declaration_t *this,location_declaration_t *param_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  
  declaration_t::declaration_t((declaration_t *)this,(declaration_t *)param_1);
  (this->super_inner_declaration_t).super_declaration_t._vptr_declaration_t =
       (_func_int **)&PTR__location_declaration_t_001235a0;
  paVar1 = &(this->_name).field_2;
  (this->_name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (param_1->_name)._M_dataplus._M_p;
  paVar2 = &(param_1->_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(param_1->_name).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->_name).field_2 + 8) = uVar4;
  }
  else {
    (this->_name)._M_dataplus._M_p = pcVar3;
    (this->_name).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->_name)._M_string_length = (param_1->_name)._M_string_length;
  (param_1->_name)._M_dataplus._M_p = (pointer)paVar2;
  (param_1->_name)._M_string_length = 0;
  (param_1->_name).field_2._M_local_buf[0] = '\0';
  (this->_process).
  super___shared_ptr<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar5 = (param_1->_process).
           super___shared_ptr<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var6 = (param_1->_process).
           super___shared_ptr<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (param_1->_process).
  super___shared_ptr<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_process).
  super___shared_ptr<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar5;
  (this->_process).
  super___shared_ptr<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var6;
  (param_1->_process).
  super___shared_ptr<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  return;
}

Assistant:

location_declaration_t::location_declaration_t(tchecker::parsing::location_declaration_t &&) = default;